

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O2

char * json_escape(char *src)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  GString *gstring;
  char *pcVar5;
  gchar c;
  
  sVar4 = strlen(src);
  gstring = (GString *)g_string_sized_new(sVar4);
  lVar1 = _g_utf8_skip;
  do {
    if (*src == 0) {
      pcVar5 = (char *)g_string_free(gstring,0);
      return pcVar5;
    }
    uVar2 = g_utf8_get_char(src);
    switch(uVar2) {
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xb:
      break;
    case 0xc:
      break;
    case 0xd:
      break;
    default:
      if (((uVar2 == 0x22) || (uVar2 == 0x27)) || (uVar2 == 0x5c)) {
        g_string_append_c_inline(gstring,'\\');
        c = (gchar)uVar2;
LAB_00106310:
        g_string_append_c_inline(gstring,c);
      }
      else {
        if (uVar2 == 0x2a) {
          c = '\\';
          goto LAB_00106310;
        }
        iVar3 = g_unichar_isgraph(uVar2);
        if ((uVar2 == 0x20) || (iVar3 != 0)) {
          gstring = (GString *)g_string_append_unichar(gstring);
        }
        else if (uVar2 < 0x10000) {
          g_string_append_printf(gstring,"\\u%04X",uVar2);
        }
        else {
          g_string_append_printf
                    (gstring,"\\u%04X\\u%04X",(uVar2 + 0x3ff0000 >> 10) + 0xd800 & 0xffff,
                     uVar2 & 0x3ff | 0xdc00);
        }
      }
      goto LAB_0010638a;
    }
    gstring = (GString *)g_string_append(gstring);
LAB_0010638a:
    src = (char *)((byte *)src + *(char *)(lVar1 + (ulong)(byte)*src));
  } while( true );
}

Assistant:

char *
json_escape (const char *src)
{
    // TODO g_string_replace from glib 2.68 does it all

    char *p = (char *) src;
    GString *s = g_string_sized_new (strlen (src));

    while (*p) {
        gunichar c = g_utf8_get_char (p);
        switch (c)
        {
        // JSON does not need to escape asterisk. This is for
        // workaround in format template
        case '*' : s = g_string_append_c (s, '\\'); break;
        case '\\':
        // For all other chars below, they are actually disallowed
        // in Windows path. This is for the mischievous who
        // move data to other OS and rename
        case 0x22:
        case 0x27:
            s = g_string_append_c (s, '\\');
            s = g_string_append_c (s, c);
            break;
        case 0x08: s = g_string_append (s, "\\b"); break;
        case 0x09: s = g_string_append (s, "\\t"); break;
        case 0x0A: s = g_string_append (s, "\\n"); break;
        case 0x0B: s = g_string_append (s, "\\v"); break;
        case 0x0C: s = g_string_append (s, "\\f"); break;
        case 0x0D: s = g_string_append (s, "\\r"); break;
        default  :
            if (g_unichar_isgraph (c) || c == 0x20)
                s = g_string_append_unichar (s, c);
            else if (c < 0x10000)
                g_string_append_printf (s, "\\u%04X", c);
            else  // calculate surrogate
            {
                uint16_t high, low;
                high = 0xD800 + ((c - 0x10000) >> 10  );
                low  = 0xDC00 + ((c - 0x10000) & 0x3FF);
                g_string_append_printf (s, "\\u%04X\\u%04X", high, low);
            }
            break;
        }
        p = g_utf8_next_char (p);
    }
    return g_string_free (s, FALSE);
}